

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O3

TableUpdateState * __thiscall
duckdb::UpdateLocalState::GetUpdateState
          (UpdateLocalState *this,DataTable *table,TableCatalogEntry *tableref,
          ClientContext *context)

{
  _Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_> _Var1;
  element_type *peVar2;
  element_type *in_RAX;
  type pTVar3;
  pointer *__ptr;
  pointer *__ptr_1;
  element_type *local_18;
  
  local_18 = in_RAX;
  if ((this->update_state).
      super_unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
      .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl ==
      (TableUpdateState *)0x0) {
    DataTable::InitializeUpdate
              ((DataTable *)&stack0xffffffffffffffe8,(TableCatalogEntry *)table,
               (ClientContext *)tableref,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)context);
    peVar2 = local_18;
    local_18 = (element_type *)0x0;
    ::std::__uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
    ::reset((__uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
             *)&this->update_state,(pointer)peVar2);
    peVar2 = local_18;
    if (local_18 != (element_type *)0x0) {
      _Var1.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
           (((tuple<duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_> *)
            &(local_18->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
             super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
           ).super__Head_base<0UL,_duckdb::ConstraintState_*,_false>;
      if (_Var1.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl !=
          (ConstraintState *)0x0) {
        operator_delete((void *)_Var1.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>.
                                _M_head_impl);
      }
      operator_delete(peVar2);
    }
  }
  pTVar3 = unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
           ::operator*(&this->update_state);
  return pTVar3;
}

Assistant:

TableUpdateState &GetUpdateState(DataTable &table, TableCatalogEntry &tableref, ClientContext &context) {
		if (!update_state) {
			update_state = table.InitializeUpdate(tableref, context, bound_constraints);
		}
		return *update_state;
	}